

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool __thiscall bssl::ssl_is_valid_trust_anchor_list(bssl *this,Span<const_unsigned_char> in)

{
  size_t sVar1;
  int iVar2;
  CBS id;
  CBS ids;
  CBS CStack_38;
  CBS local_28;
  
  local_28.len = (size_t)in.data_;
  local_28.data = (uint8_t *)this;
  do {
    sVar1 = local_28.len;
    if (((uchar *)local_28.len == (uchar *)0x0) ||
       (iVar2 = CBS_get_u8_length_prefixed(&local_28,&CStack_38), iVar2 == 0)) break;
  } while (CStack_38.len != 0);
  return (uchar *)sVar1 == (uchar *)0x0;
}

Assistant:

bool ssl_is_valid_trust_anchor_list(Span<const uint8_t> in) {
  CBS ids = in;
  while (CBS_len(&ids) > 0) {
    CBS id;
    if (!CBS_get_u8_length_prefixed(&ids, &id) ||  //
        CBS_len(&id) == 0) {
      return false;
    }
  }
  return true;
}